

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

int __thiscall
CVmObjDict::del_hash_entry
          (CVmObjDict *this,char *str,size_t len,vm_obj_id_t obj,vm_prop_id_t voc_prop)

{
  int iVar1;
  CVmHashEntryDict *this_00;
  char *pcVar2;
  
  this_00 = (CVmHashEntryDict *)
            CVmHashTable::find(*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),str,len);
  if (this_00 != (CVmHashEntryDict *)0x0) {
    pcVar2 = (this->super_CVmObject).ext_;
    if (*(vmdict_TrieNode **)(pcVar2 + 0x38) != (vmdict_TrieNode *)0x0) {
      vmdict_TrieNode::del_word(*(vmdict_TrieNode **)(pcVar2 + 0x38),str,len);
      pcVar2 = (this->super_CVmObject).ext_;
    }
    iVar1 = CVmHashEntryDict::del_entry(this_00,*(CVmHashTable **)(pcVar2 + 0x10),obj,voc_prop);
    return iVar1;
  }
  return 0;
}

Assistant:

int CVmObjDict::del_hash_entry(VMG_ const char *str, size_t len,
                               vm_obj_id_t obj, vm_prop_id_t voc_prop)
{
    CVmHashEntryDict *entry;

    /* find the hash table entry for the word */
    entry = (CVmHashEntryDict *)get_ext()->hashtab_->find(str, len);

    /* if we found it, delete the obj/prop entry */
    if (entry != 0)
    {
        /* if we have a trie, delete the trie entry */
        if (get_ext()->trie_ != 0)
            get_ext()->trie_->del_word(str, len);
        
        /* delete the hash table entry */
        return entry->del_entry(get_ext()->hashtab_, obj, voc_prop);
    }

    /* we didn't find anything to delete */
    return FALSE;
}